

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O2

void __thiscall
CombinedH264Demuxer::CombinedH264Demuxer
          (CombinedH264Demuxer *this,BufferedReaderManager *readManager,char *streamName)

{
  int iVar1;
  AbstractReader *pAVar2;
  undefined4 *puVar3;
  uint *local_1b8;
  undefined8 local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  ostringstream ss;
  
  AbstractDemuxer::AbstractDemuxer(&this->super_AbstractDemuxer);
  CombinedH264Reader::CombinedH264Reader(&this->super_CombinedH264Reader);
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer =
       (_func_int **)&PTR__CombinedH264Demuxer_0024a2f8;
  (this->super_CombinedH264Reader)._vptr_CombinedH264Reader = (_func_int **)&DAT_0024a398;
  this->m_readManager = readManager;
  pAVar2 = BufferedReaderManager::getReader(readManager,streamName);
  this->m_bufferedReader = pAVar2;
  iVar1 = (*pAVar2->_vptr_AbstractReader[6])(pAVar2,0x80);
  this->m_readerID = iVar1;
  if (this->m_bufferedReader != (AbstractReader *)0x0) {
    this->m_lastReadRez = 0;
    this->m_dataProcessed = 0;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,
                  "TS demuxer can\'t accept reader because this reader does not support BufferedReader interface"
                 );
  puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar3 = 3;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  if (local_1b8 == &local_1a8) {
    puVar3[6] = local_1a8;
    puVar3[7] = uStack_1a4;
    puVar3[8] = uStack_1a0;
    puVar3[9] = uStack_19c;
  }
  else {
    *(uint **)(puVar3 + 2) = local_1b8;
    *(ulong *)(puVar3 + 6) = CONCAT44(uStack_1a4,local_1a8);
  }
  *(undefined8 *)(puVar3 + 4) = local_1b0;
  local_1a8 = local_1a8 & 0xffffff00;
  __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

CombinedH264Demuxer::CombinedH264Demuxer(const BufferedReaderManager& readManager, const char* streamName)
    : m_readManager(readManager)
{
    m_bufferedReader = m_readManager.getReader(streamName);
    m_readerID = m_bufferedReader->createReader(MAX_TMP_BUFFER_SIZE);
    if (m_bufferedReader == nullptr)
        THROW(ERR_COMMON,
              "TS demuxer can't accept reader because this reader does not support BufferedReader interface")
    m_lastReadRez = 0;
    m_dataProcessed = 0;
}